

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-target.c
# Opt level: O0

void adjust_panel_help(wchar_t y,wchar_t x,_Bool help,player *p,wchar_t mode,point_set **targets,
                      _Bool *show_interesting,wchar_t *target_index)

{
  term_conflict2 *t_00;
  bool bVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  wchar_t wVar5;
  point_set *ppVar6;
  wchar_t local_64;
  wchar_t local_5c;
  term_conflict2 *t;
  wchar_t screen_wid;
  wchar_t screen_hgt;
  wchar_t wy;
  wchar_t wx;
  wchar_t screen_hgt_main;
  wchar_t j;
  _Bool changed;
  point_set **targets_local;
  wchar_t mode_local;
  player *p_local;
  _Bool help_local;
  wchar_t x_local;
  wchar_t y_local;
  
  bVar1 = false;
  if (help) {
    local_5c = ((Term->hgt - row_top_map[Term->sidebar_mode]) - row_bottom_map[Term->sidebar_mode])
               + L'\xfffffffe';
  }
  else {
    local_5c = (Term->hgt - row_top_map[Term->sidebar_mode]) - row_bottom_map[Term->sidebar_mode];
  }
  for (wx = L'\0'; wx < L'\b'; wx = wx + L'\x01') {
    t_00 = (term_conflict2 *)angband_term[wx];
    if ((t_00 != (term_conflict2 *)0x0) && ((wx < L'\x01' || ((window_flag[wx] & 0x80) != 0)))) {
      screen_wid = t_00->offset_y;
      screen_hgt = t_00->offset_x;
      if (wx == L'\0') {
        local_64 = (Term->wid - col_map[Term->sidebar_mode]) + L'\xffffffff';
        wVar5 = local_5c;
      }
      else {
        wVar5 = t_00->hgt;
        local_64 = t_00->wid;
      }
      iVar3 = local_64 / (int)(uint)tile_width;
      iVar4 = wVar5 / (int)(uint)tile_height;
      for (; screen_wid + iVar4 <= y; screen_wid = iVar4 / 2 + screen_wid) {
      }
      for (; y < screen_wid; screen_wid = screen_wid - iVar4 / 2) {
      }
      for (; screen_hgt + iVar3 <= x; screen_hgt = iVar3 / 2 + screen_hgt) {
      }
      for (; x < screen_hgt; screen_hgt = screen_hgt - iVar3 / 2) {
      }
      _Var2 = modify_panel(t_00,screen_wid,screen_hgt);
      if (_Var2) {
        bVar1 = true;
      }
    }
  }
  if ((bVar1) && (handle_stuff(p), targets != (point_set **)0x0)) {
    point_set_dispose((point_set_conflict *)*targets);
    ppVar6 = target_get_monsters(mode,(monster_predicate)0x0,true);
    *targets = ppVar6;
  }
  if ((show_interesting != (_Bool *)0x0) && (target_index != (wchar_t *)0x0)) {
    *show_interesting = false;
    for (wx = L'\0'; wVar5 = point_set_size((point_set_conflict *)*targets), wx < wVar5;
        wx = wx + L'\x01') {
      if ((y == (*targets)->pts[wx].y) && (x == (*targets)->pts[wx].x)) {
        *target_index = wx;
        *show_interesting = true;
        return;
      }
    }
  }
  return;
}

Assistant:

static void adjust_panel_help(int y, int x, bool help,
		struct player *p, int mode, struct point_set **targets,
		bool *show_interesting, int *target_index)
{
	bool changed = false;

	int j;

	int screen_hgt_main = help ? (Term->hgt - ROW_MAP - ROW_BOTTOM_MAP - 2)
			 : (Term->hgt - ROW_MAP - ROW_BOTTOM_MAP);

	/* Scan windows */
	for (j = 0; j < ANGBAND_TERM_MAX; j++)
	{
		int wx, wy;
		int screen_hgt, screen_wid;

		term *t = angband_term[j];

		/* No window */
		if (!t) continue;

		/* No relevant flags */
		if ((j > 0) && !(window_flag[j] & PW_OVERHEAD)) continue;

		wy = t->offset_y;
		wx = t->offset_x;

		screen_hgt = (j == 0) ? screen_hgt_main : t->hgt;
		screen_wid = (j == 0) ? (Term->wid - COL_MAP - 1) : t->wid;

		/* Bigtile panels need adjustment */
		screen_wid = screen_wid / tile_width;
		screen_hgt = screen_hgt / tile_height;

		/* Adjust as needed */
		while (y >= wy + screen_hgt) wy += screen_hgt / 2;
		while (y < wy) wy -= screen_hgt / 2;

		/* Adjust as needed */
		while (x >= wx + screen_wid) wx += screen_wid / 2;
		while (x < wx) wx -= screen_wid / 2;

		/* Use "modify_panel" */
		if (modify_panel(t, wy, wx)) changed = true;
	}

	if (changed) {
		handle_stuff(p);
		if (targets) {
			/* Recalculate interesting grids */
			point_set_dispose(*targets);
			*targets = target_get_monsters(mode, NULL, true);
		}
	}

	if (show_interesting && target_index) {
		/* Turn interesting mode off if they clicked a boring spot... */
		*show_interesting = false;

		/* ...but turn it on if they clicked an interesting spot */
		for (j = 0; j < point_set_size(*targets); j++) {
			if (y == (*targets)->pts[j].y
					&& x == (*targets)->pts[j].x) {
				*target_index = j;
				*show_interesting = true;
				break;
			}
		}
	}
}